

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall
cmListFileBacktrace::cmListFileBacktrace(cmListFileBacktrace *this,cmStateSnapshot *snapshot)

{
  cmStateSnapshot local_30;
  cmStateSnapshot *local_18;
  cmStateSnapshot *snapshot_local;
  cmListFileBacktrace *this_local;
  
  local_18 = snapshot;
  snapshot_local = (cmStateSnapshot *)this;
  cmStateSnapshot::GetCallStackBottom(&local_30,snapshot);
  std::make_shared<cmListFileBacktrace::Entry_const,cmStateSnapshot>((cmStateSnapshot *)this);
  return;
}

Assistant:

cmListFileBacktrace::cmListFileBacktrace(cmStateSnapshot const& snapshot)
  : TopEntry(std::make_shared<Entry const>(snapshot.GetCallStackBottom()))
{
}